

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::VertexToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppuVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer puVar8;
  _Alloc_hider _Var9;
  long lVar10;
  bool bVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t fv_idx;
  size_t num_vertices;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t v_idx;
  string local_128;
  unexpected_type<const_char_*> local_108;
  undefined8 local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e8;
  unsigned_long local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  void *local_b8;
  pointer puStack_b0;
  pointer local_a8;
  long *local_98;
  uint *local_90;
  _anonymous_namespace_ *local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  string local_68;
  long local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  pointer local_38;
  
  local_b8 = (void *)0x0;
  puStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  local_98 = (long *)stride_bytes;
  local_88 = this;
  local_70 = (undefined1  [8])src;
  local_40 = faceVertexCounts;
  if (*(long *)this == *(long *)(this + 8)) {
    local_108.m_error = "src data is empty.";
  }
  else {
    if (src != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      uVar5 = *(long *)(this + 8) - *(long *)this;
      if (uVar5 % (ulong)src == 0) {
        local_68.field_2._M_allocated_capacity = 0;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_e8 = __return_storage_ptr__;
        local_80._8_8_ = (pointer)(uVar5 / (ulong)src);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_70 + 8),
                   (size_type)src);
        local_e0 = 0;
        lVar6 = *local_98;
        if (local_98[1] != lVar6) {
          local_90 = (uint *)((long)&(local_e8->contained).
                                     super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     .field_0 + 0x10);
          lVar10 = 0;
          do {
            uVar5 = (ulong)*(uint *)(lVar6 + local_e0 * 4);
            bVar11 = uVar5 != 0;
            if (bVar11) {
              local_48 = lVar10 * 4;
              uVar7 = 0;
              do {
                uVar4 = local_80._8_8_;
                local_80._0_8_ = lVar10 + uVar7;
                puVar8 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((pointer)((long)(local_40->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2)
                    <= (ulong)local_80._0_8_) {
                  local_d8[0] = local_c8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_d8,
                             "faeVertexIndex {} out-of-range at faceVertexCount[{}]","");
                  fmt::format<unsigned_long,unsigned_long>
                            (&local_128,(fmt *)local_d8,(string *)local_80,&local_e0,
                             (unsigned_long *)faceVertexCounts);
                  uVar3 = local_128.field_2._M_allocated_capacity._0_4_;
                  paVar1 = &local_128.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p == paVar1) {
                    local_f8._12_4_ = local_128.field_2._12_4_;
                    local_f8._8_4_ = local_128.field_2._8_4_;
                    local_108.m_error = (error_type)&local_f8;
                  }
                  else {
                    local_108.m_error = local_128._M_dataplus._M_p;
                  }
                  local_f8._M_allocated_capacity._4_4_ =
                       local_128.field_2._M_allocated_capacity._4_4_;
                  local_f8._M_allocated_capacity._0_4_ =
                       local_128.field_2._M_allocated_capacity._0_4_;
                  local_128.field_2._M_allocated_capacity._0_4_ =
                       local_128.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108.m_error == &local_f8) {
                    *local_90 = uVar3;
                    local_90[1] = local_128.field_2._M_allocated_capacity._4_4_;
                    local_90[2] = local_f8._8_4_;
                    local_90[3] = local_f8._12_4_;
                  }
                  else {
                    (local_e8->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)local_108.m_error;
                    (local_e8->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_f8._M_allocated_capacity;
                  }
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._M_string_length;
                  local_f8._M_allocated_capacity =
                       local_f8._M_allocated_capacity & 0xffffffffffffff00;
                  local_100 = 0;
                  local_128._M_string_length = 0;
                  local_128._M_dataplus._M_p = (pointer)paVar1;
                  local_108.m_error = (error_type)&local_f8;
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0],local_c8[0] + 1);
                  }
LAB_0034044e:
                  if (bVar11) goto LAB_003404cf;
                  break;
                }
                puVar8 = (pointer)(ulong)*(uint *)((long)puVar8 + uVar7 * 4 + local_48);
                local_38 = puVar8;
                if (puVar8 < (ulong)local_80._8_8_) {
                  memcpy(local_68._M_dataplus._M_p,
                         (void *)((long)local_70 * (long)puVar8 + *(long *)local_88),
                         (size_t)local_70);
                  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b8,
                             puStack_b0,local_68._M_dataplus._M_p,local_68._M_string_length);
                }
                else {
                  local_d8[0] = local_c8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_d8,
                             "faeVertexIndices[{}] {} exceeds the number of vertices {}","");
                  faceVertexCounts =
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_80 + 8);
                  fmt::format<unsigned_long,unsigned_long,unsigned_long>
                            (&local_128,(fmt *)local_d8,(string *)local_80,
                             (unsigned_long *)&local_38,(unsigned_long *)faceVertexCounts,
                             (unsigned_long *)faceVertexIndices);
                  uVar3 = local_128.field_2._M_allocated_capacity._0_4_;
                  paVar1 = &local_128.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p == paVar1) {
                    local_f8._12_4_ = local_128.field_2._12_4_;
                    local_f8._8_4_ = local_128.field_2._8_4_;
                    local_108.m_error = (error_type)&local_f8;
                  }
                  else {
                    local_108.m_error = local_128._M_dataplus._M_p;
                  }
                  local_f8._M_allocated_capacity._4_4_ =
                       local_128.field_2._M_allocated_capacity._4_4_;
                  local_f8._M_allocated_capacity._0_4_ =
                       local_128.field_2._M_allocated_capacity._0_4_;
                  local_128.field_2._M_allocated_capacity._0_4_ =
                       local_128.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108.m_error == &local_f8) {
                    *local_90 = uVar3;
                    local_90[1] = local_128.field_2._M_allocated_capacity._4_4_;
                    local_90[2] = local_f8._8_4_;
                    local_90[3] = local_f8._12_4_;
                  }
                  else {
                    (local_e8->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)local_108.m_error;
                    (local_e8->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)local_f8._M_allocated_capacity;
                  }
                  (local_e8->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._M_string_length;
                  local_f8._M_allocated_capacity =
                       local_f8._M_allocated_capacity & 0xffffffffffffff00;
                  local_100 = 0;
                  local_128._M_string_length = 0;
                  local_128._M_dataplus._M_p = (pointer)paVar1;
                  local_108.m_error = (error_type)&local_f8;
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0],local_c8[0] + 1);
                  }
                }
                if ((ulong)uVar4 <= puVar8) goto LAB_0034044e;
                uVar7 = uVar7 + 1;
                bVar11 = uVar7 < uVar5;
              } while (uVar7 != uVar5);
            }
            lVar10 = lVar10 + uVar5;
            local_e0 = local_e0 + 1;
            lVar6 = *local_98;
          } while (local_e0 < (ulong)(local_98[1] - lVar6 >> 2));
        }
        (local_e8->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (local_e8->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_b8;
        (local_e8->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_b0;
        (local_e8->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_a8;
        local_b8 = (void *)0x0;
        puStack_b0 = (pointer)0x0;
        local_a8 = (pointer)0x0;
LAB_003404cf:
        __return_storage_ptr__ = local_e8;
        if ((long *)local_68._M_dataplus._M_p == (long *)0x0) goto LAB_00340589;
        uVar5 = local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p;
        _Var9._M_p = local_68._M_dataplus._M_p;
      }
      else {
        local_d8[0] = local_c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"src size {} must be the multiple of stride_bytes {}","");
        local_68._M_dataplus._M_p = (pointer)(*(long *)(local_88 + 8) - *(long *)local_88);
        fmt::format<unsigned_long,unsigned_long>
                  (&local_128,(fmt *)local_d8,(string *)(local_70 + 8),(unsigned_long *)local_70,
                   (unsigned_long *)faceVertexCounts);
        paVar1 = &local_128.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p == paVar1) {
          local_f8._8_8_ = CONCAT44(local_128.field_2._12_4_,local_128.field_2._8_4_);
          local_108.m_error = (error_type)&local_f8;
        }
        else {
          local_108.m_error = local_128._M_dataplus._M_p;
        }
        local_f8._M_allocated_capacity._4_4_ = local_128.field_2._M_allocated_capacity._4_4_;
        local_f8._M_allocated_capacity._0_4_ = local_128.field_2._M_allocated_capacity._0_4_;
        local_128.field_2._M_allocated_capacity._0_4_ =
             local_128.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        ppuVar2 = &(__return_storage_ptr__->contained).
                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0.m_value.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.m_error == &local_f8) {
          *ppuVar2 = (pointer)local_f8._M_allocated_capacity;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->contained).
                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x18) = local_f8._8_8_;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)local_108.m_error;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._M_allocated_capacity;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_128._M_string_length;
        local_f8._M_allocated_capacity = local_f8._M_allocated_capacity & 0xffffffffffffff00;
        local_100 = 0;
        local_128._M_string_length = 0;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        local_108.m_error = (error_type)&local_f8;
        if (local_d8[0] == local_c8) goto LAB_00340589;
        uVar5 = local_c8[0] + 1;
        _Var9._M_p = (pointer)local_d8[0];
      }
      operator_delete(_Var9._M_p,uVar5);
      goto LAB_00340589;
    }
    local_108.m_error = "stride_bytes must be non-zero.";
  }
  nonstd::expected_lite::
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<const_char_*,_0>(__return_storage_ptr__,&local_108);
LAB_00340589:
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> VertexToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices) {
  std::vector<uint8_t> dst;

  if (src.empty()) {
    return nonstd::make_unexpected("src data is empty.");
  }

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes must be non-zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("src size {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  const size_t num_vertices = src.size() / stride_bytes;

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  size_t faceVertexIndexOffset{0};

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    for (size_t k = 0; k < cnt; k++) {
      size_t fv_idx = k + faceVertexIndexOffset;

      if (fv_idx >= faceVertexIndices.size()) {
        return nonstd::make_unexpected(
            fmt::format("faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                        fv_idx, i));
      }

      size_t v_idx = faceVertexIndices[fv_idx];

      if (v_idx >= num_vertices) {
        return nonstd::make_unexpected(fmt::format(
            "faeVertexIndices[{}] {} exceeds the number of vertices {}", fv_idx,
            v_idx, num_vertices));
      }

      memcpy(buf.data(), src.data() + v_idx * stride_bytes, stride_bytes);
      dst.insert(dst.end(), buf.begin(), buf.end());
    }

    faceVertexIndexOffset += cnt;
  }

  return dst;
}